

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_diag.c
# Opt level: O0

int CVDiagGetLastFlag(void *cvode_mem,long *flag)

{
  undefined8 *in_RSI;
  CVodeMem in_RDI;
  CVDiagMem cvdiag_mem;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0xf3,"CVDiagGetLastFlag",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_diag.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0xfb,"CVDiagGetLastFlag",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_diag.c"
                   ,"CVDIAG memory is NULL.");
    local_4 = -2;
  }
  else {
    *in_RSI = *(undefined8 *)((long)in_RDI->cv_lmem + 0x28);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVDiagGetLastFlag(void* cvode_mem, long int* flag)
{
  CVodeMem cv_mem;
  CVDiagMem cvdiag_mem;

  /* Return immediately if cvode_mem is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (lmem == NULL)
  {
    cvProcessError(cv_mem, CVDIAG_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_LMEM_NULL);
    return (CVDIAG_LMEM_NULL);
  }
  cvdiag_mem = (CVDiagMem)lmem;

  *flag = last_flag;

  return (CVDIAG_SUCCESS);
}